

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O2

char * __thiscall cmsys::RegExpCompile::reg(RegExpCompile *this,int paren,int *flagp)

{
  int iVar1;
  ulong in_RAX;
  char *val;
  char *val_00;
  uint uVar2;
  char *pcVar3;
  char op;
  int flags;
  undefined8 uStack_38;
  
  *flagp = 1;
  uStack_38 = in_RAX;
  if (paren == 0) {
    op = '\0';
    pcVar3 = (char *)0x0;
  }
  else {
    iVar1 = this->regnpar;
    if (9 < iVar1) {
      pcVar3 = "RegularExpression::compile(): Too many parentheses.";
      goto LAB_00309fa0;
    }
    this->regnpar = iVar1 + 1;
    pcVar3 = regnode(this,(char)iVar1 + '\x14');
    op = (char)iVar1 + '\x1e';
  }
  val = regbranch(this,(int *)((long)&uStack_38 + 4));
  if (val == (char *)0x0) {
    return (char *)0x0;
  }
  if (pcVar3 != (char *)0x0) {
    regtail(pcVar3,val);
    val = pcVar3;
  }
  uVar2 = *flagp & 0xfffffffe;
  if ((uStack_38 & 0x100000000) != 0) {
    uVar2 = *flagp;
  }
  while( true ) {
    *flagp = uStack_38._4_4_ & 4 | uVar2;
    if (*this->regparse != '|') break;
    this->regparse = this->regparse + 1;
    pcVar3 = regbranch(this,(int *)((long)&uStack_38 + 4));
    if (pcVar3 == (char *)0x0) {
      return (char *)0x0;
    }
    regtail(val,pcVar3);
    uVar2 = *flagp;
    if ((uStack_38 & 0x100000000) == 0) {
      uVar2 = uVar2 & 0xfffffffe;
      *flagp = uVar2;
    }
  }
  val_00 = regnode(this,op);
  regtail(val,val_00);
  for (pcVar3 = val; pcVar3 != (char *)0x0; pcVar3 = regnext(pcVar3)) {
    regoptail(pcVar3,val_00);
  }
  pcVar3 = this->regparse;
  if (paren == 0) {
    if (*pcVar3 == '\0') {
      return val;
    }
    if (*pcVar3 != ')') {
      pcVar3 = "RegularExpression::compile(): Internal error.";
      goto LAB_00309fa0;
    }
  }
  else {
    this->regparse = pcVar3 + 1;
    if (*pcVar3 == ')') {
      return val;
    }
  }
  pcVar3 = "RegularExpression::compile(): Unmatched parentheses.";
LAB_00309fa0:
  puts(pcVar3);
  return (char *)0x0;
}

Assistant:

char* RegExpCompile::reg(int paren, int* flagp)
{
  char* ret;
  char* br;
  char* ender;
  int parno = 0;
  int flags;

  *flagp = HASWIDTH; // Tentatively.

  // Make an OPEN node, if parenthesized.
  if (paren) {
    if (regnpar >= RegularExpressionMatch::NSUBEXP) {
      // RAISE Error, SYM(RegularExpression), SYM(Too_Many_Parens),
      printf("RegularExpression::compile(): Too many parentheses.\n");
      return KWSYS_NULLPTR;
    }
    parno = regnpar;
    regnpar++;
    ret = regnode(static_cast<char>(OPEN + parno));
  } else
    ret = KWSYS_NULLPTR;

  // Pick up the branches, linking them together.
  br = regbranch(&flags);
  if (br == KWSYS_NULLPTR)
    return (KWSYS_NULLPTR);
  if (ret != KWSYS_NULLPTR)
    regtail(ret, br); // OPEN -> first.
  else
    ret = br;
  if (!(flags & HASWIDTH))
    *flagp &= ~HASWIDTH;
  *flagp |= flags & SPSTART;
  while (*regparse == '|') {
    regparse++;
    br = regbranch(&flags);
    if (br == KWSYS_NULLPTR)
      return (KWSYS_NULLPTR);
    regtail(ret, br); // BRANCH -> BRANCH.
    if (!(flags & HASWIDTH))
      *flagp &= ~HASWIDTH;
    *flagp |= flags & SPSTART;
  }

  // Make a closing node, and hook it on the end.
  ender = regnode(static_cast<char>((paren) ? CLOSE + parno : END));
  regtail(ret, ender);

  // Hook the tails of the branches to the closing node.
  for (br = ret; br != KWSYS_NULLPTR; br = regnext(br))
    regoptail(br, ender);

  // Check for proper termination.
  if (paren && *regparse++ != ')') {
    // RAISE Error, SYM(RegularExpression), SYM(Unmatched_Parens),
    printf("RegularExpression::compile(): Unmatched parentheses.\n");
    return KWSYS_NULLPTR;
  } else if (!paren && *regparse != '\0') {
    if (*regparse == ')') {
      // RAISE Error, SYM(RegularExpression), SYM(Unmatched_Parens),
      printf("RegularExpression::compile(): Unmatched parentheses.\n");
      return KWSYS_NULLPTR;
    } else {
      // RAISE Error, SYM(RegularExpression), SYM(Internal_Error),
      printf("RegularExpression::compile(): Internal error.\n");
      return KWSYS_NULLPTR;
    }
    // NOTREACHED
  }
  return (ret);
}